

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandAbc9Flow2(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Gia_Man_t *p;
  Vec_Int_t *pVVar2;
  int iVar3;
  uint uVar4;
  uint fMinAve;
  uint fUseMfs;
  int nLevels;
  char *pcVar5;
  char *pcVar6;
  uint fVerbose;
  int iVar7;
  uint fBalance;
  uint local_50;
  uint local_4c;
  
  fBalance = 0;
  Extra_UtilGetoptReset();
  local_4c = 8;
  local_50 = 6;
  fMinAve = 0;
  fUseMfs = 0;
  fVerbose = 0;
  do {
    while( true ) {
      while (iVar3 = Extra_UtilGetopt(argc,argv,"KCbtmvh"), iVar7 = globalUtilOptind, iVar3 == 0x76)
      {
        fVerbose = fVerbose ^ 1;
      }
      if (iVar3 < 0x62) break;
      if (iVar3 == 0x62) {
        fBalance = fBalance ^ 1;
      }
      else if (iVar3 == 0x6d) {
        fUseMfs = fUseMfs ^ 1;
      }
      else {
        if (iVar3 != 0x74) goto LAB_00282f6d;
        fMinAve = fMinAve ^ 1;
      }
    }
    if (iVar3 == -1) {
      p = pAbc->pGia;
      if (p != (Gia_Man_t *)0x0) {
        pVVar2 = p->vMapping;
        iVar7 = p->vCos->nSize;
        iVar3 = p->vCis->nSize;
        iVar1 = p->nObjs;
        nLevels = Gia_ManLevelNum(p);
        Gia_ManPerformFlow2((uint)(pVVar2 != (Vec_Int_t *)0x0),~(iVar7 + iVar3) + iVar1,nLevels,
                            local_50,local_4c,fBalance,fMinAve,fUseMfs,fVerbose);
        return 0;
      }
      pcVar5 = "Abc_CommandAbc9Flow2(): There is no AIG.\n";
      iVar7 = -1;
      goto LAB_00283052;
    }
    if (iVar3 == 0x43) {
      if (argc <= globalUtilOptind) {
        pcVar5 = "Command line switch \"-C\" should be followed by an integer.\n";
        goto LAB_00282f61;
      }
      uVar4 = atoi(argv[globalUtilOptind]);
      local_4c = uVar4;
    }
    else {
      if (iVar3 != 0x4b) goto LAB_00282f6d;
      if (argc <= globalUtilOptind) {
        pcVar5 = "Command line switch \"-K\" should be followed by an integer.\n";
LAB_00282f61:
        Abc_Print(-1,pcVar5);
        goto LAB_00282f6d;
      }
      uVar4 = atoi(argv[globalUtilOptind]);
      local_50 = uVar4;
    }
    globalUtilOptind = iVar7 + 1;
    if ((int)uVar4 < 0) {
LAB_00282f6d:
      Abc_Print(-2,"usage: &flow2 [-KC num] [-btmvh]\n");
      Abc_Print(-2,"\t         integration optimization and mapping flow\n");
      Abc_Print(-2,"\t-K num : the number of LUT inputs (LUT size) [default = %d]\n",(ulong)local_50
               );
      Abc_Print(-2,"\t-C num : the number of cuts at a node [default = %d]\n",(ulong)local_4c);
      pcVar6 = "yes";
      pcVar5 = "yes";
      if (fBalance == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-b     : toggle using SOP balancing during synthesis [default = %s]\n",pcVar5)
      ;
      pcVar5 = "yes";
      if (fMinAve == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-t     : toggle minimizing average (not maximum) level [default = %s]\n",
                pcVar5);
      pcVar5 = "yes";
      if (fUseMfs == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-m     : toggle using \"mfs2\" in the script [default = %s]\n",pcVar5);
      if (fVerbose == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar6);
      pcVar5 = "\t-h     : print the command usage\n";
      iVar7 = -2;
LAB_00283052:
      Abc_Print(iVar7,pcVar5);
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9Flow2( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Gia_ManPerformFlow2( int fIsMapped, int nAnds, int nLevels, int nLutSize, int nCutNum, int fBalance, int fMinAve, int fUseMfs, int fVerbose );
    int nLutSize    =  6;
    int nCutNum     =  8;
    int fBalance    =  0;
    int fMinAve     =  0;
    int fUseMfs     =  0;
    int c, fVerbose =  0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "KCbtmvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'K':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-K\" should be followed by an integer.\n" );
                goto usage;
            }
            nLutSize = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nLutSize < 0 )
                goto usage;
            break;
         case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            nCutNum = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nCutNum < 0 )
                goto usage;
            break;
        case 'b':
            fBalance ^= 1;
            break;
        case 't':
            fMinAve ^= 1;
            break;
        case 'm':
            fUseMfs ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Flow2(): There is no AIG.\n" );
        return 1;
    }
    Gia_ManPerformFlow2( Gia_ManHasMapping(pAbc->pGia), Gia_ManAndNum(pAbc->pGia), Gia_ManLevelNum(pAbc->pGia), nLutSize, nCutNum, fBalance, fMinAve, fUseMfs, fVerbose );
    return 0;

usage:
    Abc_Print( -2, "usage: &flow2 [-KC num] [-btmvh]\n" );
    Abc_Print( -2, "\t         integration optimization and mapping flow\n" );
    Abc_Print( -2, "\t-K num : the number of LUT inputs (LUT size) [default = %d]\n", nLutSize );
    Abc_Print( -2, "\t-C num : the number of cuts at a node [default = %d]\n", nCutNum );
    Abc_Print( -2, "\t-b     : toggle using SOP balancing during synthesis [default = %s]\n", fBalance? "yes": "no" );
    Abc_Print( -2, "\t-t     : toggle minimizing average (not maximum) level [default = %s]\n", fMinAve? "yes": "no" );
    Abc_Print( -2, "\t-m     : toggle using \"mfs2\" in the script [default = %s]\n", fUseMfs? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}